

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_sync_handler_failed_application_exception_branch
          (t_rs_generator *this,t_function *tfunc,string *app_err_var)

{
  ostream *poVar1;
  string sStack_38;
  
  if (tfunc->oneway_ == true) {
    t_generator::indent_abi_cxx11_(&sStack_38,&this->super_t_generator);
    poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&sStack_38);
    poVar1 = std::operator<<(poVar1,"Err(thrift::Error::Application(");
    poVar1 = std::operator<<(poVar1,(string *)app_err_var);
    poVar1 = std::operator<<(poVar1,"))");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&sStack_38);
    return;
  }
  render_sync_handler_send_exception_response(this,tfunc,app_err_var);
  return;
}

Assistant:

void t_rs_generator::render_sync_handler_failed_application_exception_branch(
    t_function *tfunc,
    const string &app_err_var
) {
  if (tfunc->is_oneway()) {
    f_gen_ << indent() << "Err(thrift::Error::Application(" << app_err_var << "))" << endl;
  } else {
    render_sync_handler_send_exception_response(tfunc, app_err_var);
  }
}